

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiKeyChord GetMergedModsFromKeys(void)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  
  bVar2 = ImGui::IsKeyDown(ImGuiKey_ModCtrl,0);
  bVar3 = ImGui::IsKeyDown(ImGuiKey_ModShift,0);
  uVar4 = (uint)bVar2 * 0x1000 + 0x2000;
  if (!bVar3) {
    uVar4 = (uint)bVar2 * 0x1000;
  }
  bVar2 = ImGui::IsKeyDown(ImGuiKey_ModAlt,0);
  uVar1 = uVar4 + 0x4000;
  if (!bVar2) {
    uVar1 = uVar4;
  }
  bVar2 = ImGui::IsKeyDown(ImGuiKey_ModSuper,0);
  uVar4 = uVar1 | 0x8000;
  if (!bVar2) {
    uVar4 = uVar1;
  }
  return uVar4;
}

Assistant:

bool ImGui::IsKeyDown(ImGuiKey key)
{
    return IsKeyDown(key, ImGuiKeyOwner_Any);
}